

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalUnixMakefileGenerator3.cxx
# Opt level: O1

void __thiscall
cmGlobalUnixMakefileGenerator3::ComputeTargetObjectDirectory
          (cmGlobalUnixMakefileGenerator3 *this,cmGeneratorTarget *gt)

{
  pointer pcVar1;
  size_type sVar2;
  string *psVar3;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string dir;
  string local_110;
  long *local_f0;
  undefined8 local_e8;
  long local_e0 [2];
  undefined8 local_d0;
  undefined1 *puStack_c8;
  undefined1 local_c0 [32];
  undefined8 local_a0;
  undefined1 *local_98;
  undefined1 local_90 [32];
  basic_string_view<char,_std::char_traits<char>_> local_70;
  undefined8 local_60;
  undefined1 *puStack_58;
  undefined8 local_50;
  long *local_48;
  undefined8 local_40;
  undefined1 *local_38;
  
  psVar3 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(gt->LocalGenerator);
  pcVar1 = (psVar3->_M_dataplus)._M_p;
  sVar2 = psVar3->_M_string_length;
  puStack_c8 = local_c0;
  local_d0 = 1;
  local_c0[0] = 0x2f;
  (*gt->LocalGenerator->_vptr_cmLocalGenerator[0xe])(&local_f0,gt->LocalGenerator,gt);
  local_60 = local_d0;
  puStack_58 = puStack_c8;
  local_50 = local_e8;
  local_48 = local_f0;
  local_98 = local_90;
  local_a0 = 1;
  local_90[0] = 0x2f;
  local_40 = 1;
  views._M_len = 4;
  views._M_array = &local_70;
  local_70._M_len = sVar2;
  local_70._M_str = pcVar1;
  local_38 = local_98;
  cmCatViews_abi_cxx11_(&local_110,views);
  if (local_f0 != local_e0) {
    operator_delete(local_f0,local_e0[0] + 1);
  }
  std::__cxx11::string::_M_assign((string *)&gt->ObjectDirectory);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmGlobalUnixMakefileGenerator3::ComputeTargetObjectDirectory(
  cmGeneratorTarget* gt) const
{
  // Compute full path to object file directory for this target.
  std::string dir =
    cmStrCat(gt->LocalGenerator->GetCurrentBinaryDirectory(), '/',
             gt->LocalGenerator->GetTargetDirectory(gt), '/');
  gt->ObjectDirectory = dir;
}